

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

xpath_ast_node * __thiscall
pugi::impl::anon_unknown_0::xpath_parser::parse_step(xpath_parser *this,xpath_ast_node *set)

{
  xpath_lexer_string *pxVar1;
  byte bVar2;
  lexeme_t lVar3;
  lexeme_t lVar4;
  bool bVar5;
  bool bVar6;
  nodetest_t nVar7;
  xpath_ast_node *pxVar8;
  char_t *pcVar9;
  xpath_ast_node *pxVar10;
  xpath_ast_node *pxVar11;
  xpath_ast_node **ppxVar12;
  char cVar13;
  xpath_parser *this_00;
  char cVar14;
  char *pcVar15;
  xpath_ast_node *pxVar16;
  xpath_parser *local_50;
  xpath_lexer_string local_48;
  xpath_lexer_string *local_38;
  
  if ((set == (xpath_ast_node *)0x0) || (this_00 = this, set->_rettype == '\x01')) {
    this_00 = (xpath_parser *)&this->_lexer;
    lVar3 = (this->_lexer)._cur_lexeme;
    if (lVar3 == lex_double_dot) {
      xpath_lexer::next((xpath_lexer *)this_00);
      pxVar8 = (xpath_ast_node *)alloc_node(this);
      pxVar8->_type = '8';
      pxVar8->_rettype = '\x01';
      pxVar8->_axis = '\t';
      pxVar8->_test = '\x02';
LAB_0011f911:
      pxVar8->_left = set;
      pxVar8->_right = (xpath_ast_node *)0x0;
      pxVar8->_next = (xpath_ast_node *)0x0;
      (pxVar8->_data).string = (char_t *)0x0;
      return pxVar8;
    }
    if (lVar3 == lex_dot) {
      xpath_lexer::next((xpath_lexer *)this_00);
      pxVar8 = (xpath_ast_node *)alloc_node(this);
      pxVar8->_type = '8';
      pxVar8->_rettype = '\x01';
      pxVar8->_axis = '\f';
      pxVar8->_test = '\x02';
      goto LAB_0011f911;
    }
    pcVar15 = &set->_type;
    if (lVar3 != lex_axis_attribute) {
      cVar13 = '\x03';
    }
    else {
      xpath_lexer::next((xpath_lexer *)this_00);
      cVar13 = '\x02';
    }
    local_48.begin = (char_t *)0x0;
    local_48.end = (char_t *)0x0;
    lVar4 = (this->_lexer)._cur_lexeme;
    local_50 = this;
    if (lVar4 == lex_multiply) {
      xpath_lexer::next((xpath_lexer *)this_00);
      cVar14 = '\a';
LAB_0011fcd7:
      pxVar8 = (xpath_ast_node *)alloc_node(this);
      pcVar9 = alloc_string(this,&local_48);
      pxVar8->_type = '8';
      pxVar8->_rettype = '\x01';
      pxVar8->_axis = cVar13;
      pxVar8->_test = cVar14;
      pxVar8->_left = set;
      pxVar8->_right = (xpath_ast_node *)0x0;
      pxVar8->_next = (xpath_ast_node *)0x0;
      (pxVar8->_data).string = pcVar9;
      if ((this->_lexer)._cur_lexeme != lex_open_square_brace) {
        return pxVar8;
      }
      pxVar16 = (xpath_ast_node *)0x0;
      while( true ) {
        xpath_lexer::next((xpath_lexer *)this_00);
        pxVar10 = parse_expression(this);
        pxVar11 = (xpath_ast_node *)alloc_node(this);
        pxVar11->_type = '\x0f';
        pxVar11->_rettype = '\x01';
        pxVar11->_axis = '\0';
        pxVar11->_test = '\0';
        pxVar11->_left = pxVar10;
        pxVar11->_right = (xpath_ast_node *)0x0;
        pxVar11->_next = (xpath_ast_node *)0x0;
        if ((this->_lexer)._cur_lexeme != lex_close_square_brace) break;
        xpath_lexer::next((xpath_lexer *)this_00);
        ppxVar12 = &pxVar16->_next;
        if (pxVar16 == (xpath_ast_node *)0x0) {
          ppxVar12 = &pxVar8->_right;
        }
        *ppxVar12 = pxVar11;
        pxVar16 = pxVar11;
        if ((this->_lexer)._cur_lexeme != lex_open_square_brace) {
          return pxVar8;
        }
      }
      throw_error(this,"Unmatched square brace");
      goto LAB_0011fdab;
    }
    if (lVar4 == lex_string) {
      pxVar1 = &(this->_lexer)._cur_lexeme_contents;
      local_48.begin = (this->_lexer)._cur_lexeme_contents.begin;
      local_48.end = (this->_lexer)._cur_lexeme_contents.end;
      xpath_lexer::next((xpath_lexer *)this_00);
      local_38 = pxVar1;
      if ((this->_lexer)._cur_lexeme == lex_double_colon) {
        if (lVar3 == lex_axis_attribute) {
          pcVar15 = "Two axis specifiers in one step";
          goto LAB_0011fdd3;
        }
        bVar2 = *(byte *)(xpath_memory_block **)local_48.begin;
        if (bVar2 < 0x6e) {
          switch(bVar2) {
          case 0x61:
            pcVar15 = "ancestor";
            bVar5 = xpath_lexer_string::operator==(&local_48,"ancestor");
            cVar13 = '\0';
            bVar6 = true;
            if (!bVar5) {
              pcVar15 = "ancestor-or-self";
              bVar5 = xpath_lexer_string::operator==(&local_48,"ancestor-or-self");
              cVar13 = '\x01';
              if (!bVar5) {
                pcVar15 = "attribute";
                bVar5 = xpath_lexer_string::operator==(&local_48,"attribute");
                cVar13 = '\x02';
                goto LAB_0011fb6b;
              }
            }
            break;
          default:
            goto switchD_0011f9b5_caseD_62;
          case 99:
            pcVar15 = "child";
            bVar6 = xpath_lexer_string::operator==(&local_48,"child");
            if (!bVar6) goto switchD_0011f9b5_caseD_62;
            cVar13 = '\x03';
LAB_0011fb19:
            bVar6 = true;
            break;
          case 100:
            pcVar15 = "descendant";
            bVar5 = xpath_lexer_string::operator==(&local_48,"descendant");
            cVar13 = '\x04';
            bVar6 = true;
            if (!bVar5) {
              pcVar15 = "descendant-or-self";
              bVar5 = xpath_lexer_string::operator==(&local_48,"descendant-or-self");
              cVar13 = '\x05';
LAB_0011fb6b:
              bVar6 = true;
              if (bVar5 == false) goto switchD_0011f9b5_caseD_62;
            }
            break;
          case 0x66:
            pcVar15 = "following";
            bVar5 = xpath_lexer_string::operator==(&local_48,"following");
            cVar13 = '\x06';
            bVar6 = true;
            if (!bVar5) {
              pcVar15 = "following-sibling";
              bVar5 = xpath_lexer_string::operator==(&local_48,"following-sibling");
              cVar13 = '\a';
              goto LAB_0011fb6b;
            }
          }
        }
        else {
          if (bVar2 == 0x6e) {
            pcVar15 = "namespace";
            bVar6 = xpath_lexer_string::operator==(&local_48,"namespace");
            if (bVar6) {
              cVar13 = '\b';
              goto LAB_0011fb19;
            }
          }
          else {
            if (bVar2 == 0x70) {
              pcVar15 = "parent";
              bVar5 = xpath_lexer_string::operator==(&local_48,"parent");
              cVar13 = '\t';
              bVar6 = true;
              if (!bVar5) {
                pcVar15 = "preceding";
                bVar5 = xpath_lexer_string::operator==(&local_48,"preceding");
                cVar13 = '\n';
                if (!bVar5) {
                  pcVar15 = "preceding-sibling";
                  bVar5 = xpath_lexer_string::operator==(&local_48,"preceding-sibling");
                  cVar13 = '\v';
                  goto LAB_0011fb6b;
                }
              }
              goto LAB_0011fb76;
            }
            if (bVar2 == 0x73) {
              pcVar15 = "self";
              bVar6 = xpath_lexer_string::operator==(&local_48,"self");
              if (bVar6) {
                cVar13 = '\f';
                goto LAB_0011fb19;
              }
            }
          }
switchD_0011f9b5_caseD_62:
          cVar13 = '\x03';
          bVar6 = false;
        }
LAB_0011fb76:
        if (!bVar6) {
          pcVar15 = "Unknown axis";
          goto LAB_0011fdd3;
        }
        xpath_lexer::next((xpath_lexer *)this_00);
        lVar3 = (this->_lexer)._cur_lexeme;
        if (lVar3 == lex_string) {
          local_48.begin = pxVar1->begin;
          local_48.end = (this->_lexer)._cur_lexeme_contents.end;
          cVar14 = '\0';
          bVar6 = true;
        }
        else {
          if (lVar3 != lex_multiply) goto LAB_0011fdba;
          local_48.begin = (char_t *)0x0;
          local_48.end = (char_t *)0x0;
          cVar14 = '\a';
          bVar6 = false;
        }
        xpath_lexer::next((xpath_lexer *)this_00);
      }
      else {
        cVar14 = '\0';
        bVar6 = true;
      }
      if (bVar6) {
        if ((this->_lexer)._cur_lexeme == lex_open_brace) {
          xpath_lexer::next((xpath_lexer *)this_00);
          lVar3 = (this->_lexer)._cur_lexeme;
          if (lVar3 == lex_close_brace) {
            xpath_lexer::next((xpath_lexer *)this_00);
            nVar7 = parse_node_test_type((xpath_parser *)&local_48,(xpath_lexer_string *)pcVar15);
            if (nVar7 == nodetest_none) goto LAB_0011fddd;
            local_48.begin = (char_t *)0x0;
            local_48.end = (char_t *)0x0;
          }
          else {
            bVar6 = xpath_lexer_string::operator==(&local_48,"processing-instruction");
            if (!bVar6) {
              pcVar15 = "Unmatched brace near node type test";
              goto LAB_0011fdd3;
            }
            if (lVar3 != lex_quoted_string) {
              pcVar15 = "Only literals are allowed as arguments to processing-instruction()";
              goto LAB_0011fdd3;
            }
            lVar3 = (this->_lexer)._cur_lexeme;
            if ((lex_string < lVar3) ||
               ((0x10c800U >> (lVar3 & (lex_double_dot|lex_plus)) & 1) == 0)) {
              __assert_fail("_cur_lexeme == lex_var_ref || _cur_lexeme == lex_number || _cur_lexeme == lex_string || _cur_lexeme == lex_quoted_string"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/elmindreda[P]greg/deps/pugixml.cpp"
                            ,0x1c69,
                            "const xpath_lexer_string &pugi::impl::(anonymous namespace)::xpath_lexer::contents() const"
                           );
            }
            local_48.begin = local_38->begin;
            local_48.end = local_38->end;
            xpath_lexer::next((xpath_lexer *)this_00);
            if ((this->_lexer)._cur_lexeme != lex_close_brace) {
              pcVar15 = "Unmatched brace near processing-instruction()";
              goto LAB_0011fdd3;
            }
            xpath_lexer::next((xpath_lexer *)this_00);
            nVar7 = nodetest_pi;
          }
          cVar14 = (char)nVar7;
        }
        else {
          cVar14 = '\x01';
          if (((2 < (long)local_48.end - (long)local_48.begin) && (local_48.end[-2] == ':')) &&
             (local_48.end[-1] == '*')) {
            local_48.end = local_48.end + -1;
            cVar14 = '\b';
          }
        }
      }
      goto LAB_0011fcd7;
    }
  }
  else {
LAB_0011fdab:
    throw_error(this_00,"Step has to be applied to node set");
  }
LAB_0011fdba:
  pcVar15 = "Unrecognized node test";
LAB_0011fdd3:
  do {
    throw_error(local_50,pcVar15);
LAB_0011fddd:
    pcVar15 = "Unrecognized node type";
  } while( true );
}

Assistant:

xpath_ast_node* parse_step(xpath_ast_node* set)
		{
			if (set && set->rettype() != xpath_type_node_set)
				throw_error("Step has to be applied to node set");

			bool axis_specified = false;
			axis_t axis = axis_child; // implied child axis

			if (_lexer.current() == lex_axis_attribute)
			{
				axis = axis_attribute;
				axis_specified = true;
				
				_lexer.next();
			}
			else if (_lexer.current() == lex_dot)
			{
				_lexer.next();
				
				return new (alloc_node()) xpath_ast_node(ast_step, set, axis_self, nodetest_type_node, 0);
			}
			else if (_lexer.current() == lex_double_dot)
			{
				_lexer.next();
				
				return new (alloc_node()) xpath_ast_node(ast_step, set, axis_parent, nodetest_type_node, 0);
			}
		
			nodetest_t nt_type = nodetest_none;
			xpath_lexer_string nt_name;
			
			if (_lexer.current() == lex_string)
			{
				// node name test
				nt_name = _lexer.contents();
				_lexer.next();

				// was it an axis name?
				if (_lexer.current() == lex_double_colon)
				{
					// parse axis name
					if (axis_specified) throw_error("Two axis specifiers in one step");

					axis = parse_axis_name(nt_name, axis_specified);

					if (!axis_specified) throw_error("Unknown axis");

					// read actual node test
					_lexer.next();

					if (_lexer.current() == lex_multiply)
					{
						nt_type = nodetest_all;
						nt_name = xpath_lexer_string();
						_lexer.next();
					}
					else if (_lexer.current() == lex_string)
					{
						nt_name = _lexer.contents();
						_lexer.next();
					}
					else throw_error("Unrecognized node test");
				}
				
				if (nt_type == nodetest_none)
				{
					// node type test or processing-instruction
					if (_lexer.current() == lex_open_brace)
					{
						_lexer.next();
						
						if (_lexer.current() == lex_close_brace)
						{
							_lexer.next();

							nt_type = parse_node_test_type(nt_name);

							if (nt_type == nodetest_none) throw_error("Unrecognized node type");
							
							nt_name = xpath_lexer_string();
						}
						else if (nt_name == PUGIXML_TEXT("processing-instruction"))
						{
							if (_lexer.current() != lex_quoted_string)
								throw_error("Only literals are allowed as arguments to processing-instruction()");
						
							nt_type = nodetest_pi;
							nt_name = _lexer.contents();
							_lexer.next();
							
							if (_lexer.current() != lex_close_brace)
								throw_error("Unmatched brace near processing-instruction()");
							_lexer.next();
						}
						else
							throw_error("Unmatched brace near node type test");

					}
					// QName or NCName:*
					else
					{
						if (nt_name.end - nt_name.begin > 2 && nt_name.end[-2] == ':' && nt_name.end[-1] == '*') // NCName:*
						{
							nt_name.end--; // erase *
							
							nt_type = nodetest_all_in_namespace;
						}
						else nt_type = nodetest_name;
					}
				}
			}
			else if (_lexer.current() == lex_multiply)
			{
				nt_type = nodetest_all;
				_lexer.next();
			}
			else throw_error("Unrecognized node test");
			
			xpath_ast_node* n = new (alloc_node()) xpath_ast_node(ast_step, set, axis, nt_type, alloc_string(nt_name));
			
			xpath_ast_node* last = 0;
			
			while (_lexer.current() == lex_open_square_brace)
			{
				_lexer.next();
				
				xpath_ast_node* expr = parse_expression();

				xpath_ast_node* pred = new (alloc_node()) xpath_ast_node(ast_predicate, xpath_type_node_set, expr);
				
				if (_lexer.current() != lex_close_square_brace)
					throw_error("Unmatched square brace");
				_lexer.next();
				
				if (last) last->set_next(pred);
				else n->set_right(pred);
				
				last = pred;
			}
			
			return n;
		}